

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O2

void displayLimitCycleInfo
               (ostream *o,PolynomialFDS *pds,
               vector<ComponentData,_std::allocator<ComponentData>_> *cycleinfo)

{
  pointer pCVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  State u;
  ulong local_58;
  State local_50;
  
  poVar2 = std::operator<<(o,"Number of cycles (components): ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  State::State(&local_50,pds->mNumStates,
               (int)((ulong)((long)(pds->mPolynomials).
                                   super__Vector_base<Polynomial,_std::allocator<Polynomial>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pds->mPolynomials).
                                  super__Vector_base<Polynomial,_std::allocator<Polynomial>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 6));
  local_58 = 0;
  while( true ) {
    pCVar1 = (cycleinfo->super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(cycleinfo->super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 5) <= local_58)
    break;
    lVar4 = (long)*(pointer *)
                   ((long)&pCVar1[local_58].limitCycle.
                           super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) -
            *(long *)&pCVar1[local_58].limitCycle.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl;
    poVar2 = std::operator<<(o,"COMPONENT #");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2,":");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(o,"  component size: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    if (lVar4 == 8) {
      plVar3 = *(long **)&(cycleinfo->
                          super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl
                          .super__Vector_impl_data._M_start[local_58].limitCycle.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl;
      pcVar5 = "  fixed point: [";
    }
    else {
      poVar2 = std::operator<<(o,"  cycle of length ");
      lVar4 = lVar4 >> 3;
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2,": ");
      std::endl<char,std::char_traits<char>>(poVar2);
      if (lVar4 < 1) {
        lVar4 = 0;
      }
      for (lVar6 = 0;
          plVar3 = *(long **)&(cycleinfo->
                              super__Vector_base<ComponentData,_std::allocator<ComponentData>_>).
                              _M_impl.super__Vector_impl_data._M_start[local_58].limitCycle.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl,
          lVar4 != lVar6; lVar6 = lVar6 + 1) {
        State::setFromIndex(&local_50,plVar3[lVar6]);
        poVar2 = std::operator<<(o,"    [");
        poVar2 = operator<<(poVar2,&local_50);
        poVar2 = std::operator<<(poVar2,"] -> ");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      pcVar5 = "    [";
    }
    State::setFromIndex(&local_50,*plVar3);
    poVar2 = std::operator<<(o,pcVar5);
    poVar2 = operator<<(poVar2,&local_50);
    poVar2 = std::operator<<(poVar2,"]");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    local_58 = local_58 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_50.mState.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void displayLimitCycleInfo(std::ostream& o,
                           const PolynomialFDS& pds,
                           const std::vector<ComponentData>& cycleinfo)
{
  o << "Number of cycles (components): " << cycleinfo.size() << std::endl << std::endl;
  State u(pds.numStates(), pds.numVariables());  
  for (long i=0; i<cycleinfo.size(); i++)
    {
      long cyclelen = cycleinfo[i].limitCycle.size();
      o << "COMPONENT #" << i+1 << ":" << std::endl;
      o << "  component size: " << cycleinfo[i].componentSize << std::endl;
      if (cyclelen == 1)
        {
          u.setFromIndex(cycleinfo[i].limitCycle[0]);
          o << "  fixed point: [" << u << "]" << std::endl << std::endl;
        }
      else {
        o << "  cycle of length " << cyclelen << ": " << std::endl;
        for (int j=0; j<cyclelen; j++)
          {
            u.setFromIndex(cycleinfo[i].limitCycle[j]);
            o << "    [" << u << "] -> " << std::endl;
          }
        u.setFromIndex(cycleinfo[i].limitCycle[0]);
        o << "    [" << u << "]" << std::endl << std::endl;
      }
    }
}